

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type.cpp
# Opt level: O3

FieldEncodingEnum
bidfx_public_api::price::pixie::FieldTypeMethods::DefaultEncoding(FieldTypeEnum field)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,field);
  if (iVar1 < 0x49) {
    if (iVar1 == 0x20) {
      return NOOP;
    }
  }
  else {
    if (iVar1 == 0x49) {
      return FIXED4;
    }
    if (iVar1 != 0x4c) {
      return VARINT_STRING;
    }
  }
  return FIXED8;
}

Assistant:

FieldEncodingEnum FieldTypeMethods::DefaultEncoding(FieldTypeEnum field)
{
    switch(field)
    {
        case UNRECOGNISED:
            return FieldEncodingEnum::NOOP;
        case DOUBLE:
            return FieldEncodingEnum::FIXED8;
        case INTEGER:
            return FieldEncodingEnum::FIXED4;
        case LONG:
            return FieldEncodingEnum::FIXED8;
        case STRING:
            return FieldEncodingEnum::VARINT_STRING;
    }
}